

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu_com.c
# Opt level: O1

MPP_RET adjust_input(H264dVdpuPriv_t *priv,DXVA_Slice_H264_Long *p_long,DXVA_PicParams_H264_MVC *pp)

{
  H264dVdpuDpbInfo_t *__s;
  DXVA_PicEntry_H264 DVar1;
  undefined3 uVar2;
  RK_U16 RVar3;
  RK_S32 *pRVar4;
  RK_U32 *pRVar5;
  RK_U16 *pRVar6;
  RK_U8 *pRVar7;
  long lVar8;
  long lVar9;
  DXVA_PicEntry_H264 (*paDVar10) [32];
  ulong uVar11;
  anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *paVar12;
  uint uVar13;
  RK_S32 *pRVar14;
  H264dVdpuDpbInfo_t *pHVar15;
  long lVar16;
  H264dVdpuDpbInfo_t *pHVar17;
  H264dVdpuDpbInfo_t *pHVar18;
  bool bVar19;
  H264dVdpuDpbInfo_t *new_dpb;
  byte bVar20;
  H264dVdpuDpbInfo_t *pHVar21;
  anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *pic;
  byte bVar22;
  
  bVar22 = 0;
  __s = priv->new_dpb;
  bVar20 = 0;
  memset(__s,0,0x440);
  memset(priv->refinfo,0,0x480);
  pRVar5 = &priv->new_dpb[0].is_ilt_flag;
  lVar9 = 0;
  do {
    if (pp->RefFrameList[lVar9].field_0.bPicEntry != 0xff) {
      ((H264dVdpuDpbInfo_t *)(pRVar5 + -0xd))->valid = '\x01';
      DVar1.field_0 =
           (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)
           pp->RefFrameList[lVar9].field_0.bPicEntry;
      pRVar5[-0xb] = (uint)((byte)DVar1.field_0 >> 7);
      pRVar5[-0xc] = pp->RefFrameList[lVar9].field_0.bPicEntry & 0x7f;
      pRVar5[-10] = pp->FieldOrderCntList[lVar9][0];
      pRVar5[-9] = pp->FieldOrderCntList[lVar9][1];
      if ((char)DVar1.field_0 < '\0') {
        pRVar5[-7] = (uint)pp->FrameNumList[lVar9];
      }
      else {
        *(RK_U16 *)(pRVar5 + -8) = pp->FrameNumList[lVar9];
      }
      pRVar5[-6] = (uint)pp->LongTermPicNumList[lVar9];
      uVar13 = pp->UsedForReferenceFlags >> (bVar20 & 0x1f);
      pRVar5[-5] = uVar13 & 1;
      pRVar5[-4] = (uVar13 & 2) >> 1;
      uVar13 = (uint)lVar9;
      pRVar5[-2] = (uint)((pp->RefPicColmvUsedFlags >> (uVar13 & 0x1f) & 1) != 0);
      pRVar5[-1] = (uint)((pp->RefPicFiledFlags >> (uVar13 & 0x1f) & 1) != 0);
      *pRVar5 = (uint)((pp->UsedForInTerviewflags >> (uVar13 & 0x1f) & 1) != 0);
    }
    lVar9 = lVar9 + 1;
    bVar20 = bVar20 + 2;
    pRVar5 = pRVar5 + 0x11;
  } while (lVar9 != 0x10);
  lVar9 = 0x456;
  pRVar6 = pp->ViewIDList;
  do {
    *(uint *)((long)(priv->old_dpb + -1) + 0x43c + lVar9 * 2) = (uint)*pRVar6;
    lVar9 = lVar9 + 0x22;
    pRVar6 = pRVar6 + 1;
  } while (lVar9 != 0x676);
  lVar9 = 0x8bc;
  pRVar7 = pp->RefPicLayerIdList;
  do {
    *(uint *)((long)(priv->old_dpb + -1) + 0x43c + lVar9) = (uint)*pRVar7;
    lVar9 = lVar9 + 0x44;
    pRVar7 = pRVar7 + 1;
  } while (lVar9 != 0xcfc);
  paVar12 = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *)p_long->RefPicList;
  pRVar4 = &priv->refinfo[0][0].bottom_flag;
  lVar9 = 0;
  paDVar10 = (DXVA_PicEntry_H264 (*) [32])paVar12;
  do {
    lVar16 = 0;
    pRVar14 = pRVar4;
    do {
      if ((*paDVar10)[lVar16].field_0.bPicEntry != 0xff) {
        ((H264dVdpuRefPicInfo_t *)(pRVar14 + -2))->valid = 1;
        pRVar14[-1] = (*paDVar10)[lVar16].field_0.bPicEntry & 0x7f;
        *pRVar14 = (uint)((*paDVar10)[lVar16].field_0.bPicEntry >> 7);
      }
      lVar16 = lVar16 + 1;
      pRVar14 = pRVar14 + 3;
    } while (lVar16 != 0x20);
    lVar9 = lVar9 + 1;
    pRVar4 = pRVar4 + 0x60;
    paDVar10 = paDVar10 + 1;
  } while (lVar9 != 3);
  uVar11 = (ulong)priv->layed_id;
  pHVar21 = priv->old_dpb[uVar11];
  lVar9 = 0;
  do {
    pHVar17 = pHVar21 + lVar9;
    if (pHVar21[lVar9].valid != '\0') {
      lVar16 = 0;
LAB_001e24c7:
      if ((&__s->valid)[lVar16] == '\0') goto LAB_001e2528;
      bVar19 = pHVar17->slot_index == *(int *)((long)&priv->new_dpb[0].slot_index + lVar16) &&
               pHVar17->frame_num == *(RK_U16 *)((long)&priv->new_dpb[0].frame_num + lVar16);
      if (((*(int *)((long)&priv->new_dpb[0].top_used + lVar16) != 0) && (pHVar17->top_used != 0))
         && (pHVar17->top_poc != *(int *)((long)&priv->new_dpb[0].top_poc + lVar16))) {
        bVar19 = false;
      }
      if (((*(int *)((long)&priv->new_dpb[0].bot_used + lVar16) != 0) && (pHVar17->bot_used != 0))
         && (pHVar17->bot_poc != *(int *)((long)&priv->new_dpb[0].bot_poc + lVar16))) {
        bVar19 = false;
      }
      if (!bVar19) goto LAB_001e2528;
      (&priv->new_dpb[0].have_same)[lVar16] = '\x01';
      *(int *)((long)&priv->new_dpb[0].new_dpb_idx + lVar16) = (int)lVar9;
      pRVar7 = &__s->valid + lVar16;
      for (lVar8 = 0x11; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(undefined4 *)pHVar17 = *(undefined4 *)pRVar7;
        pRVar7 = pRVar7 + ((ulong)bVar22 * -2 + 1) * 4;
        pHVar17 = (H264dVdpuDpbInfo_t *)((long)pHVar17 + (ulong)bVar22 * -8 + 4);
      }
      goto LAB_001e2563;
    }
LAB_001e2535:
    pHVar17->field_flag = 0;
    pHVar17->is_ilt_flag = 0;
    pHVar17->voidx = 0;
    pHVar17->have_same = '\0';
    *(undefined3 *)&pHVar17->field_0x3d = 0;
    pHVar17->top_used = 0;
    pHVar17->bot_used = 0;
    pHVar17->view_id = 0;
    pHVar17->colmv_is_used = 0;
    pHVar17->bot_poc = 0;
    pHVar17->frame_num = 0;
    *(undefined2 *)&pHVar17->field_0x16 = 0;
    pHVar17->long_term_frame_idx = 0;
    pHVar17->long_term_pic_num = 0;
    pHVar17->valid = '\0';
    *(undefined3 *)&pHVar17->field_0x1 = 0;
    pHVar17->slot_index = 0;
    pHVar17->is_long_term = 0;
    pHVar17->top_poc = 0;
    pHVar17->new_dpb_idx = 0;
LAB_001e2563:
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  lVar9 = 0;
  do {
    if ((__s[lVar9].valid != '\0') && (pHVar17 = __s + lVar9, pHVar17->have_same == '\0')) {
      lVar16 = 0;
      pHVar18 = pHVar21;
LAB_001e2594:
      if (pHVar18->valid != '\0') goto code_r0x001e2599;
      pHVar15 = pHVar17;
      for (lVar8 = 0x11; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar2 = *(undefined3 *)&pHVar15->field_0x1;
        pHVar18->valid = pHVar15->valid;
        *(undefined3 *)&pHVar18->field_0x1 = uVar2;
        pHVar15 = (H264dVdpuDpbInfo_t *)((long)pHVar15 + (ulong)bVar22 * -8 + 4);
        pHVar18 = (H264dVdpuDpbInfo_t *)((long)pHVar18 + (ulong)bVar22 * -8 + 4);
      }
      pHVar17->new_dpb_idx = (RK_U32)lVar16;
    }
LAB_001e25b6:
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  priv->ilt_dpb = (H264dVdpuDpbInfo_t *)0x0;
  if (uVar11 != 0) {
    lVar9 = 0;
    do {
      if (((&pHVar21->valid)[lVar9] == '\0') &&
         (*(int *)((long)&priv->old_dpb[uVar11][0].is_ilt_flag + lVar9) != 0)) {
        priv->ilt_dpb = (H264dVdpuDpbInfo_t *)(&pHVar21->valid + lVar9);
        break;
      }
      lVar9 = lVar9 + 0x44;
    } while (lVar9 != 0x440);
  }
  pRVar4 = &priv->refinfo[0][0].dpb_idx;
  lVar9 = 0;
  do {
    lVar16 = 0;
    do {
      if (*(int *)((long)pRVar4 + lVar16 + -4) != 0) {
        *(RK_U32 *)((long)pRVar4 + lVar16) =
             priv->new_dpb[*(int *)((long)pRVar4 + lVar16)].new_dpb_idx;
      }
      lVar16 = lVar16 + 0xc;
    } while (lVar16 != 0x180);
    lVar9 = lVar9 + 1;
    pRVar4 = pRVar4 + 0x60;
  } while (lVar9 != 3);
  pp->UsedForReferenceFlags = 0;
  pp->RefPicColmvUsedFlags = 0;
  pp->RefPicFiledFlags = 0;
  pp->UsedForInTerviewflags = 0;
  bVar20 = 0;
  lVar9 = 0;
  do {
    if (((H264dVdpuDpbInfo_t *)&pHVar21->valid)->valid == '\0') {
      pp->RefFrameList[lVar9].field_0 = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)0xff;
      pp->FieldOrderCntList[lVar9] = (RK_S32  [2])0x0;
      pp->FrameNumList[lVar9] = 0;
      pp->LongTermPicNumList[lVar9] = 0;
    }
    else {
      fill_picture_entry(pp->RefFrameList + lVar9,pHVar21->slot_index,pHVar21->is_long_term);
      pp->FieldOrderCntList[lVar9][0] = pHVar21->top_poc;
      pp->FieldOrderCntList[lVar9][1] = pHVar21->bot_poc;
      if (pHVar21->is_long_term == 0) {
        RVar3 = pHVar21->frame_num;
      }
      else {
        RVar3 = (RK_U16)pHVar21->long_term_frame_idx;
      }
      pp->FrameNumList[lVar9] = RVar3;
      pp->LongTermPicNumList[lVar9] = (RK_U16)pHVar21->long_term_pic_num;
      if (pHVar21->top_used != 0) {
        pp->UsedForReferenceFlags = pp->UsedForReferenceFlags | 1 << (bVar20 & 0x1f);
      }
      if (pHVar21->bot_used != 0) {
        pp->UsedForReferenceFlags = pp->UsedForReferenceFlags | 2 << (bVar20 & 0x1f);
      }
      bVar22 = (byte)lVar9;
      if (pHVar21->colmv_is_used != 0) {
        pp->RefPicColmvUsedFlags = pp->RefPicColmvUsedFlags | (ushort)(1 << (bVar22 & 0x1f));
      }
      if (pHVar21->field_flag != 0) {
        pp->RefPicFiledFlags = pp->RefPicFiledFlags | (ushort)(1 << (bVar22 & 0x1f));
      }
      if (pHVar21->is_ilt_flag != 0) {
        pp->UsedForInTerviewflags = pp->UsedForInTerviewflags | (ushort)(1 << (bVar22 & 0x1f));
      }
    }
    lVar9 = lVar9 + 1;
    bVar20 = bVar20 + 2;
    pHVar21 = pHVar21 + 1;
  } while (lVar9 != 0x10);
  pRVar5 = &priv->old_dpb[uVar11][0].view_id;
  lVar9 = 0;
  do {
    pp->ViewIDList[lVar9] = (RK_U16)*pRVar5;
    lVar9 = lVar9 + 1;
    pRVar5 = pRVar5 + 0x11;
  } while (lVar9 != 0x10);
  pRVar5 = &priv->old_dpb[uVar11][0].voidx;
  lVar9 = 0;
  do {
    pp->RefPicLayerIdList[lVar9] = (RK_U8)*pRVar5;
    lVar9 = lVar9 + 1;
    pRVar5 = pRVar5 + 0x11;
  } while (lVar9 != 0x10);
  pRVar4 = &priv->refinfo[0][0].bottom_flag;
  lVar9 = 0;
  do {
    lVar16 = 0;
    pic = paVar12;
    do {
      if (*(int *)((long)pRVar4 + lVar16 + -8) == 0) {
        *pic = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)0xff;
      }
      else {
        fill_picture_entry((DXVA_PicEntry_H264 *)&pic->field_0,
                           *(RK_U32 *)((long)pRVar4 + lVar16 + -4),
                           *(RK_U32 *)((long)pRVar4 + lVar16));
      }
      pic = pic + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar16 != 0x180);
    lVar9 = lVar9 + 1;
    paVar12 = paVar12 + 0x20;
    pRVar4 = pRVar4 + 0x60;
  } while (lVar9 != 3);
  return MPP_OK;
LAB_001e2528:
  lVar16 = lVar16 + 0x44;
  if (lVar16 == 0x440) goto LAB_001e2535;
  goto LAB_001e24c7;
code_r0x001e2599:
  lVar16 = lVar16 + 1;
  pHVar18 = pHVar18 + 1;
  if (lVar16 == 0x10) goto LAB_001e25b6;
  goto LAB_001e2594;
}

Assistant:

MPP_RET adjust_input(H264dVdpuPriv_t *priv,
                     DXVA_Slice_H264_Long *p_long,
                     DXVA_PicParams_H264_MVC  *pp)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    get_info_input(priv, p_long, pp);
    //!< dpb mapping to new order
    {
        RK_U32 i = 0, j = 0;
        RK_U32 find_flag = 0;
        H264dVdpuDpbInfo_t *new_dpb = priv->new_dpb;
        H264dVdpuDpbInfo_t *old_dpb = priv->old_dpb[priv->layed_id];

#if DEBUG_REF_LIST
        {
            mpp_log("=== frame_num %d ===\n", pp->frame_num);
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                mpp_log("old_dpb[%d] frame_num=%d field=%d poc0=%d poc1=%d\n",
                        i, old_dpb[i].frame_num, old_dpb[i].field_flag, old_dpb[i].top_poc, old_dpb[i].bot_poc);
            }
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                mpp_log("new_dpb[%d] frame_num=%d field=%d poc0=%d poc1=%d\n",
                        i, new_dpb[i].frame_num, new_dpb[i].field_flag, new_dpb[i].top_poc, new_dpb[i].bot_poc);
            }
        }
#endif
        //!< delete old dpb
        for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
            find_flag = 0;
            if (old_dpb[i].valid) {
                for (j = 0; j < MPP_ARRAY_ELEMS(priv->new_dpb); j++) {
                    if (new_dpb[j].valid) {
                        find_flag =
                            ((old_dpb[i].frame_num == new_dpb[j].frame_num)
                             ? 1 : 0);
                        find_flag = ((old_dpb[i].slot_index
                                      == new_dpb[j].slot_index)
                                     ? find_flag : 0);
                        if (new_dpb[j].top_used && old_dpb[i].top_used) {
                            find_flag =
                                ((old_dpb[i].top_poc == new_dpb[j].top_poc)
                                 ? find_flag : 0);
                        }
                        if (new_dpb[j].bot_used && old_dpb[i].bot_used) {
                            find_flag  =
                                ((old_dpb[i].bot_poc == new_dpb[j].bot_poc)
                                 ? find_flag : 0);
                        }
                        if (find_flag) { //!< found
                            new_dpb[j].have_same = 1;
                            new_dpb[j].new_dpb_idx = i;
                            old_dpb[i] = new_dpb[j];
                            break;
                        }
                    }
                }
            }
            //!< not found
            if (find_flag == 0) {
                memset(&old_dpb[i], 0, sizeof(old_dpb[i]));
            }
        }
        //!< add new dpb
        for (j = 0; j < MPP_ARRAY_ELEMS(priv->new_dpb); j++) {
            if ((new_dpb[j].valid == 0) || new_dpb[j].have_same) {
                continue;
            }
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                if (old_dpb[i].valid == 0) {
                    old_dpb[i] = new_dpb[j];
                    new_dpb[j].new_dpb_idx = i;
                    break;
                }
            }
        }
        //!< inter-layer reference
        priv->ilt_dpb = NULL;
        if (priv->layed_id) {
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[1]); i++) {
                if ((old_dpb[i].valid == 0) && old_dpb[i].is_ilt_flag) {
                    priv->ilt_dpb = &old_dpb[i];
                    break;
                }
            }
        }
    }
    //!< addjust ref_dpb
    {
        RK_U32 i = 0, j = 0;
        H264dVdpuDpbInfo_t *new_dpb = priv->new_dpb;

        for (j = 0; j < 3; j++) {
            H264dVdpuRefPicInfo_t *p = priv->refinfo[j];
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->refinfo[j]); i++) {
                if (p[i].valid) {
                    p[i].dpb_idx = new_dpb[p[i].dpb_idx].new_dpb_idx;
                }
            }
        }
    }
    refill_info_input(priv, p_long, pp);

    return ret = MPP_OK;
}